

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImageQuad
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,
          ImVec2 *uv1,ImVec2 *uv2,ImVec2 *uv3,ImVec2 *uv4,ImU32 col)

{
  bool bVar1;
  void **ppvVar2;
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  void *in_RSI;
  ImDrawList *in_RDI;
  ImVec2 *in_R8;
  ImVec2 *in_R9;
  bool bVar3;
  ImVec2 *in_stack_00000008;
  ImVec2 *in_stack_00000010;
  ImDrawList *in_stack_00000018;
  ImVec2 *in_stack_00000020;
  uint in_stack_00000028;
  bool push_texture_id;
  ImTextureID in_stack_ffffffffffffff88;
  ImDrawList *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  if ((in_stack_00000028 & 0xff000000) != 0) {
    bVar1 = ImVector<void_*>::empty(&in_RDI->_TextureIdStack);
    bVar3 = true;
    if (!bVar1) {
      ppvVar2 = ImVector<void_*>::back(&in_RDI->_TextureIdStack);
      bVar3 = in_RSI != *ppvVar2;
    }
    if (bVar3) {
      PushTextureID(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    PrimReserve((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
    PrimQuadUV(in_RDI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
               (ImVec2 *)in_stack_00000018,in_stack_00000020,in_stack_00000028);
    if (bVar3) {
      PopTextureID(in_stack_00000018);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageQuad(ImTextureID user_texture_id, const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& uv1, const ImVec2& uv2, const ImVec2& uv3, const ImVec2& uv4, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimQuadUV(p1, p2, p3, p4, uv1, uv2, uv3, uv4, col);

    if (push_texture_id)
        PopTextureID();
}